

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_AsWriteableBytes_Test::TestBody(GslSpan_AsWriteableBytes_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *pcVar2;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  span<int,__1L> s_00;
  span<int,__1L> s_01;
  AssertHelper local_1f8;
  Message local_1f0;
  index_type local_1e8;
  index_type local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_6;
  Message local_1c0;
  pointer local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_5;
  undefined1 local_180 [8];
  span<unsigned_char,__1L> bs_1;
  undefined1 auStack_168 [8];
  span<int,__1L> s_1;
  Message local_150;
  void *local_148;
  pointer local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_4;
  Message local_120;
  pointer local_118;
  pointer local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  int local_e4;
  index_type local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  int local_b4;
  index_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  index_type local_78;
  index_type local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  undefined1 local_48 [8];
  span<unsigned_char,__1L> bs;
  span<int,__1L> s;
  int a [4];
  GslSpan_AsWriteableBytes_Test *this_local;
  
  s.storage_.data_ = (pointer)0x200000001;
  this_00 = &bs.storage_.data_;
  pstore::gsl::span<int,_-1L>::span((span<int,__1L> *)this_00);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )bs.storage_.data_;
  s_00.storage_.data_ = extraout_RDX;
  s_00.storage_.super_extent_type<_1L>.size_ = s.storage_.super_extent_type<_1L>.size_;
  _local_48 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
              pstore::gsl::as_writeable_bytes<int,_1l,void>((gsl *)bs.storage_.data_,s_00);
  local_70 = pstore::gsl::span<unsigned_char,_-1L>::length((span<unsigned_char,__1L> *)local_48);
  local_78 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)this_00);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_68,"bs.length ()","s.length ()",&local_70,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x515,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_b0 = pstore::gsl::span<unsigned_char,_-1L>::length((span<unsigned_char,__1L> *)local_48);
  local_b4 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_a8,"bs.length ()","0",&local_b0,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x516,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_e0 = pstore::gsl::span<unsigned_char,_-1L>::size_bytes((span<unsigned_char,__1L> *)local_48)
  ;
  local_e4 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_d8,"bs.size_bytes ()","0",&local_e0,&local_e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x517,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  local_110 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_48);
  local_118 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&bs.storage_.data_);
  testing::internal::EqHelper::Compare<void_*,_void_*,_nullptr>
            ((EqHelper *)local_108,"static_cast<void *> (bs.data ())",
             "static_cast<void *> (s.data ())",&local_110,&local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x518,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_48);
  local_148 = (void *)0x0;
  testing::internal::EqHelper::Compare<unsigned_char_*,_std::nullptr_t,_nullptr>
            ((EqHelper *)local_138,"bs.data ()","nullptr",&local_140,&local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_1.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x519,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_1.storage_.data_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_1.storage_.data_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  bs_1.storage_.data_ = (pointer)pstore::gsl::make_span<int,4ul>((int (*) [4])&s.storage_.data_);
  pstore::gsl::span<int,-1l>::span<int,4l>
            ((span<int,_1l> *)auStack_168,(span<int,_4L> *)&bs_1.storage_.data_);
  gtest_ar_5.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_168;
  s_01.storage_.data_ = extraout_RDX_00;
  s_01.storage_.super_extent_type<_1L>.size_ = s_1.storage_.super_extent_type<_1L>.size_;
  _local_180 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               pstore::gsl::as_writeable_bytes<int,_1l,void>((gsl *)auStack_168,s_01);
  local_1b0 = pstore::gsl::span<unsigned_char,_-1L>::data((span<unsigned_char,__1L> *)local_180);
  local_1b8 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)auStack_168);
  testing::internal::EqHelper::Compare<void_*,_void_*,_nullptr>
            ((EqHelper *)local_1a8,"static_cast<void *> (bs.data ())",
             "static_cast<void *> (s.data ())",&local_1b0,&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x51f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  local_1e0 = pstore::gsl::span<unsigned_char,_-1L>::length((span<unsigned_char,__1L> *)local_180);
  local_1e8 = pstore::gsl::span<int,_-1L>::length_bytes((span<int,__1L> *)auStack_168);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_1d8,"bs.length ()","s.length_bytes ()",&local_1e0,&local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x520,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  return;
}

Assistant:

TEST (GslSpan, AsWriteableBytes) {
    int a[] = {1, 2, 3, 4};

    {
#ifdef CONFIRM_COMPILATION_ERRORS
        // you should not be able to get writeable bytes for const objects
        span<const int> s = a;
        EXPECT_EQ (s.length (), 4);
        span<const byte> bs = as_writeable_bytes (s);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.length (), s.length_bytes ());
#endif
    }

    {
        span<int> s;
        auto bs = as_writeable_bytes (s);
        EXPECT_EQ (bs.length (), s.length ());
        EXPECT_EQ (bs.length (), 0);
        EXPECT_EQ (bs.size_bytes (), 0);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.data (), nullptr);
    }

    {
        span<int> s = make_span (a);
        auto bs = as_writeable_bytes (s);
        EXPECT_EQ (static_cast<void *> (bs.data ()), static_cast<void *> (s.data ()));
        EXPECT_EQ (bs.length (), s.length_bytes ());
    }
}